

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_algorithms_tests.hpp
# Opt level: O0

void test_parallel_for_task(void)

{
  int elementsCount;
  int maxBatches;
  scheduler<concurrent_queue> *this;
  task_handle *hTask;
  shared_ptr<oqpi::task_base> local_a0;
  task_handle local_90;
  task_handle local_80;
  anon_class_1_0_00000001_for_func local_6a;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
  spParallelForGroup;
  undefined1 local_28 [8];
  simple_partitioner partitioner;
  task_priority prio;
  test __t;
  
  test::test((test *)((long)&partitioner.remainder_ + 3),"test_parallel_for_task");
  elementsCount = gTaskCount;
  partitioner.remainder_._2_1_ = 2;
  this = oqpi::
         helpers<oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
         ::scheduler();
  maxBatches = oqpi::scheduler<concurrent_queue>::workersCount(this,normal);
  oqpi::simple_partitioner::simple_partitioner
            ((simple_partitioner *)local_28,elementsCount,maxBatches);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"FibonacciParallelForGroup",&local_69);
  oqpi::
  helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
  ::
  make_parallel_for_task_group<(oqpi::task_type)1,test_parallel_for_task()::__0,oqpi::simple_partitioner>
            ((helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
              *)local_48,&local_68,(simple_partitioner *)local_28,normal,&local_6a);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::shared_ptr<oqpi::task_base>::
  shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,void>
            (&local_a0,
             (shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
              *)local_48);
  oqpi::task_handle::task_handle(&local_90,&local_a0);
  hTask = &local_90;
  oqpi::
  helpers<oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
  ::schedule_task((helpers<oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
                   *)&local_80,hTask);
  oqpi::task_handle::wait(&local_80,hTask);
  oqpi::task_handle::~task_handle(&local_80);
  oqpi::task_handle::~task_handle(&local_90);
  std::shared_ptr<oqpi::task_base>::~shared_ptr(&local_a0);
  std::
  shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
  ::~shared_ptr((shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
                 *)local_48);
  test::~test((test *)((long)&partitioner.remainder_ + 3));
  return;
}

Assistant:

void test_parallel_for_task()
{
    TEST_FUNC;

    const auto prio = oqpi::task_priority::normal;
    const auto partitioner = oqpi::simple_partitioner(gTaskCount, oqpi_tk::scheduler().workersCount(prio));
    auto spParallelForGroup = oqpi_tk::make_parallel_for_task_group<oqpi::task_type::waitable>("FibonacciParallelForGroup", partitioner, prio,
        [](int32_t i)
    {
        volatile auto a = 0ull;
        a += fibonacci(gValue + a);
        a += i;
    });
    oqpi_tk::schedule_task(oqpi::task_handle(spParallelForGroup)).wait();
}